

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O0

void __thiscall SkipList::Remove(SkipList *this,int inKey)

{
  Node *pNVar1;
  Node *nodeCopy;
  Node *node;
  int inKey_local;
  SkipList *this_local;
  
  pNVar1 = Find(this,inKey);
  if (pNVar1 != (Node *)0x0) {
    if (pNVar1->top != (Node *)0x0) {
      __assert_fail("(node->top == nullptr) && \"Found node is not at the top level!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_3_data_and_algorithms/ch_18/p3ch18ex11.cpp"
                    ,0xe6,"void SkipList::Remove(int)");
    }
    if ((pNVar1->key != 0x7fffffff) && (pNVar1->key != -0x80000000)) {
      while (nodeCopy = pNVar1, nodeCopy != (Node *)0x0) {
        nodeCopy->prev->next = nodeCopy->next;
        nodeCopy->next->prev = nodeCopy->prev;
        pNVar1 = nodeCopy->bot;
        if (nodeCopy != (Node *)0x0) {
          Node::~Node(nodeCopy);
          operator_delete(nodeCopy,0x48);
        }
      }
      this->size = this->size + -1;
    }
  }
  return;
}

Assistant:

void SkipList::Remove(int inKey)
{
	Node* node = Find(inKey);
	if (node)
	{
		assert((node->top == nullptr) && "Found node is not at the top level!");
		if (node->key == TRAILER_KEY || node->key == HEADER_KEY)
		{
			return;
		}
		while(node)
		{
			Node* nodeCopy = node;
			node->prev->next = node->next;
			node->next->prev = node->prev;
			node = node->bot;
			delete nodeCopy;
		}
		--size;
	}
}